

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.h
# Opt level: O0

bool __thiscall Js::InlineCache::RemoveFromInvalidationList(InlineCache *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  InlineCache *this_local;
  
  if (this->invalidationListSlotPtr == (InlineCache **)0x0) {
    this_local._7_1_ = false;
  }
  else {
    if (*this->invalidationListSlotPtr != this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InlineCache.h"
                                  ,0xdb,"(*this->invalidationListSlotPtr == this)",
                                  "*this->invalidationListSlotPtr == this");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    *this->invalidationListSlotPtr = (InlineCache *)0x0;
    this->invalidationListSlotPtr = (InlineCache **)0x0;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool RemoveFromInvalidationList()
        {
            if (this->invalidationListSlotPtr == nullptr)
            {
                return false;
            }

            Assert(*this->invalidationListSlotPtr == this);

            *this->invalidationListSlotPtr = nullptr;
            this->invalidationListSlotPtr = nullptr;

            return true;
        }